

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_help.cpp
# Opt level: O2

void __thiscall ktx::CommandHelp::executeHelp(CommandHelp *this)

{
  bool bVar1;
  path *__p;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar2;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string systemCommand;
  string systemCommand_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string manFile;
  path executableDir;
  path executablePath;
  
  this_00 = &systemCommand;
  std::filesystem::__cxx11::path::path<char[15],std::filesystem::__cxx11::path>
            ((path *)&systemCommand,(char (*) [15])"/proc/self/exe",auto_format);
  std::filesystem::canonical(&executablePath);
  std::filesystem::__cxx11::path::~path((path *)&systemCommand);
  std::filesystem::__cxx11::path::path((path *)&systemCommand,&executablePath);
  __p = (path *)std::filesystem::__cxx11::path::remove_filename();
  std::filesystem::__cxx11::path::path(&executableDir,__p);
  std::filesystem::__cxx11::path::~path((path *)&systemCommand);
  std::filesystem::__cxx11::path::string(&systemCommand_1,&executableDir);
  bVar1 = *(bool *)((long)&(this->options).super_OptionsHelp.command.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   + 0x20);
  pcVar2 = "";
  std::optional<std::__cxx11::string>::value_or<char_const(&)[1]>
            (&local_b8,(optional<std::__cxx11::string> *)&this->options,(char (*) [1])0x1e9e0c);
  if (bVar1 != false) {
    pcVar2 = "_";
  }
  systemCommand._M_dataplus = systemCommand_1._M_dataplus;
  systemCommand._M_string_length = systemCommand_1._M_string_length;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&systemCommand;
  fmt.size_ = 0xdcd;
  fmt.data_ = (char *)0x1e;
  systemCommand.field_2._M_allocated_capacity = (size_type)pcVar2;
  ::fmt::v10::vformat_abi_cxx11_(&manFile,(v10 *)"{}/../share/man/man1/ktx{}{}.1",fmt,args);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&systemCommand_1);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&systemCommand,&manFile,auto_format);
  bVar1 = std::filesystem::exists((path *)&systemCommand);
  std::filesystem::__cxx11::path::~path((path *)&systemCommand);
  if (bVar1) {
    systemCommand_1._M_dataplus = manFile._M_dataplus;
    systemCommand_1._M_string_length = manFile._M_string_length;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&systemCommand_1;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x8;
    ::fmt::v10::vformat_abi_cxx11_(&systemCommand,(v10 *)"man \"{}\"",fmt_00,args_00);
    system(systemCommand._M_dataplus._M_p);
  }
  else {
    bVar1 = *(bool *)((long)&(this->options).super_OptionsHelp.command.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     + 0x20);
    pcVar2 = "";
    std::optional<std::__cxx11::string>::value_or<char_const(&)[1]>
              (&local_b8,(optional<std::__cxx11::string> *)&this->options,(char (*) [1])0x1e9e0c);
    if (bVar1 != false) {
      pcVar2 = "_";
    }
    systemCommand.field_2._M_allocated_capacity = (size_type)local_b8._M_dataplus._M_p;
    systemCommand.field_2._8_8_ = local_b8._M_string_length;
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)&systemCommand;
    fmt_01.size_ = 0xdc;
    fmt_01.data_ = (char *)0xb;
    systemCommand._M_dataplus._M_p = pcVar2;
    ::fmt::v10::vformat_abi_cxx11_(&systemCommand_1,(v10 *)"man ktx{}{}",fmt_01,args_01);
    std::__cxx11::string::~string((string *)&local_b8);
    system(systemCommand_1._M_dataplus._M_p);
    this_00 = &systemCommand_1;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&manFile);
  std::filesystem::__cxx11::path::~path(&executableDir);
  std::filesystem::__cxx11::path::~path(&executablePath);
  return;
}

Assistant:

void CommandHelp::executeHelp() {
    // On windows open the html pages with the browser
    // On linux/macos open the man pages with man

#if defined(_WIN32)
    DWORD size = 256;
    std::wstring executablePath;
    do {
        size *= 2;
        executablePath.resize(size);
    } while (GetModuleFileNameW(nullptr, executablePath.data(), size) == size);

    PathCchRemoveFileSpec(executablePath.data(), executablePath.size());
    executablePath.resize(wcslen(executablePath.c_str()));

    const auto commandStr = options.command.value_or("");
    const auto systemCommand = fmt::format(L"{}\\..\\share\\doc\\KTX-Software\\html\\ktxtools\\ktx{}{}.html",
            executablePath,
            options.command ? L"_" : L"",
            std::wstring(commandStr.begin(), commandStr.end()));

    auto result = ShellExecuteW(nullptr, nullptr, systemCommand.c_str(), nullptr, nullptr, SW_SHOWNORMAL);
    auto r = reinterpret_cast<INT_PTR>(result);
    if (r <= 32) // WinAPI is weird
        fatal(rc::RUNTIME_ERROR, "Failed to open the html documentation: ERROR {}", r);

#else
#   if defined(__APPLE__)
    char buf[PATH_MAX];
    uint32_t bufsize = PATH_MAX;
    if (const auto ec = _NSGetExecutablePath(buf, &bufsize))
        fatal(rc::RUNTIME_ERROR, "Failed to determine executable path: ERROR {}", ec);
    const auto executablePath = std::filesystem::canonical(buf);
#   else // Linux
    const auto executablePath = std::filesystem::canonical("/proc/self/exe");
#   endif

    const auto executableDir = std::filesystem::path(executablePath).remove_filename();
    const auto manFile = fmt::format("{}/../share/man/man1/ktx{}{}.1",
                executableDir.string(),
                options.command ? "_" : "",
                options.command.value_or(""));
    if (std::filesystem::exists(manFile)) {
        // We have relative access to the man file, prioritize opening it
        // that way to support custom install locations
        const auto systemCommand = fmt::format("man \"{}\"", manFile);
        const auto result = std::system(systemCommand.c_str());
        (void) result;
    } else {
        const auto systemCommand = fmt::format("man ktx{}{}",
                options.command ? "_" : "",
                options.command.value_or(""));
        const auto result = std::system(systemCommand.c_str());
        (void) result;
    }
#endif
}